

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence.cpp
# Opt level: O3

int64_t __thiscall
spvtools::opt::anon_unknown_15::CalculateGCDFromCoefficients
          (anon_unknown_15 *this,
          vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
          *recurrences,int64_t running_gcd)

{
  long lVar1;
  long b;
  
  if (this != (anon_unknown_15 *)recurrences) {
    do {
      lVar1 = (**(code **)(**(long **)(*(long *)this + 0x30) + 0x20))();
      lVar1 = *(long *)(lVar1 + 0x30);
      b = -lVar1;
      if (0 < lVar1) {
        b = lVar1;
      }
      running_gcd = GreatestCommonDivisor(running_gcd,b);
      this = this + 8;
    } while (this != (anon_unknown_15 *)recurrences);
  }
  return running_gcd;
}

Assistant:

int64_t CalculateGCDFromCoefficients(
    const std::vector<SERecurrentNode*>& recurrences, int64_t running_gcd) {
  for (SERecurrentNode* recurrence : recurrences) {
    auto coefficient = recurrence->GetCoefficient()->AsSEConstantNode();

    running_gcd = GreatestCommonDivisor(
        running_gcd, std::abs(coefficient->FoldToSingleValue()));
  }

  return running_gcd;
}